

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlogin.c
# Opt level: O0

int rlogin_exitcode(Backend *be)

{
  Rlogin *rlogin;
  Backend *be_local;
  
  if (be[-6].interactor == (Interactor *)0x0) {
    if (((ulong)be[-5].vt & 1) == 0) {
      be_local._4_4_ = 0;
    }
    else {
      be_local._4_4_ = 0x7fffffff;
    }
  }
  else {
    be_local._4_4_ = -1;
  }
  return be_local._4_4_;
}

Assistant:

static int rlogin_exitcode(Backend *be)
{
    Rlogin *rlogin = container_of(be, Rlogin, backend);
    if (rlogin->s != NULL)
        return -1;                     /* still connected */
    else if (rlogin->closed_on_socket_error)
        return INT_MAX;     /* a socket error counts as an unclean exit */
    else
        /* If we ever implement RSH, we'll probably need to do this properly */
        return 0;
}